

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesUserHints(cmFindPackageCommand *this)

{
  pointer pbVar1;
  mapped_type *searchPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *p;
  pointer path;
  string debugBuffer;
  string local_c0;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  searchPath = std::
               map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
               ::operator[](&(this->super_cmFindCommon).LabeledPaths,&cmFindCommon::PathLabel::Hints
                           );
  pbVar1 = (this->super_cmFindCommon).UserHintsArgs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (path = (this->super_cmFindCommon).UserHintsArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; path != pbVar1; path = path + 1) {
    cmSearchPath::AddUserPath(searchPath,path);
  }
  if ((this->super_cmFindCommon).DebugMode != false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"Paths specified by the find_package HINTS option.\n",
               (allocator<char> *)&local_80);
    anon_unknown.dwarf_d105b2::collectPathsForDebug(&local_c0,searchPath,0);
    local_80.View_._M_str = (this->DebugBuffer)._M_dataplus._M_p;
    local_80.View_._M_len = (this->DebugBuffer)._M_string_length;
    local_50.View_._M_len = local_c0._M_string_length;
    local_50.View_._M_str = local_c0._M_dataplus._M_p;
    cmStrCat<>(&local_a0,&local_80,&local_50);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesUserHints()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::Hints];

  for (std::string const& p : this->UserHintsArgs) {
    paths.AddUserPath(p);
  }
  if (this->DebugMode) {
    std::string debugBuffer =
      "Paths specified by the find_package HINTS option.\n";
    collectPathsForDebug(debugBuffer, paths);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}